

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_bool nk_do_button_symbol(nk_flags *state,nk_command_buffer *out,nk_rect bounds,
                           nk_symbol_type symbol,nk_button_behavior behavior,nk_style_button *style,
                           nk_input *in,nk_user_font *font)

{
  long lVar1;
  undefined8 uVar2;
  long lVar3;
  undefined8 uVar4;
  nk_rect r;
  undefined4 in_ECX;
  undefined4 in_EDX;
  long in_RSI;
  long in_RDI;
  nk_rect *in_R8;
  nk_command_buffer *in_R9;
  long in_stack_00000008;
  nk_rect content;
  int ret;
  nk_rect *in_stack_ffffffffffffffa0;
  nk_button_behavior in_stack_ffffffffffffffac;
  nk_input *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  float fVar5;
  undefined4 uVar6;
  nk_flags local_4;
  
  fVar5 = (float)in_RDI;
  uVar6 = (undefined4)((ulong)in_RDI >> 0x20);
  if ((((in_RSI == 0) || (in_R8 == (nk_rect *)0x0)) || (in_stack_00000008 == 0)) || (in_RDI == 0)) {
    local_4 = 0;
  }
  else {
    r._4_8_ = in_RSI;
    r.x = (float)in_EDX;
    r.h = fVar5;
    local_4 = nk_do_button((nk_flags *)in_R8,in_R9,r,
                           (nk_style_button *)
                           CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                           in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                           in_stack_ffffffffffffffa0);
    lVar1._0_4_ = in_R8[10].x;
    lVar1._4_4_ = in_R8[10].y;
    if (lVar1 != 0) {
      uVar2._0_4_ = in_R8[9].w;
      uVar2._4_4_ = in_R8[9].h;
      (**(code **)(in_R8 + 10))(in_RSI,uVar2);
    }
    nk_draw_button_symbol
              ((nk_command_buffer *)CONCAT44(in_EDX,in_ECX),in_R8,(nk_rect *)in_R9,local_4,
               (nk_style_button *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
               (nk_user_font *)CONCAT44(uVar6,fVar5));
    lVar3._0_4_ = in_R8[10].w;
    lVar3._4_4_ = in_R8[10].h;
    if (lVar3 != 0) {
      uVar4._0_4_ = in_R8[9].w;
      uVar4._4_4_ = in_R8[9].h;
      (**(code **)&in_R8[10].w)(in_RSI,uVar4);
    }
  }
  return local_4;
}

Assistant:

NK_LIB nk_bool
nk_do_button_symbol(nk_flags *state,
struct nk_command_buffer *out, struct nk_rect bounds,
enum nk_symbol_type symbol, enum nk_button_behavior behavior,
const struct nk_style_button *style, const struct nk_input *in,
const struct nk_user_font *font)
{
int ret;
struct nk_rect content;

NK_ASSERT(state);
NK_ASSERT(style);
NK_ASSERT(font);
NK_ASSERT(out);
if (!out || !style || !font || !state)
return nk_false;

ret = nk_do_button(state, out, bounds, style, in, behavior, &content);
if (style->draw_begin) style->draw_begin(out, style->userdata);
nk_draw_button_symbol(out, &bounds, &content, *state, style, symbol, font);
if (style->draw_end) style->draw_end(out, style->userdata);
return ret;
}